

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

ResourceData *
getFallbackData(UResourceBundle *resBundle,char **resTag,UResourceDataEntry **realData,Resource *res
               ,UErrorCode *status)

{
  char *__s1;
  UResourceDataEntry *pUVar1;
  UResourceDataEntry **ppUVar2;
  Resource RVar3;
  int iVar4;
  char *__s2;
  UErrorCode UVar5;
  UResourceDataEntry *pUVar6;
  uint uVar7;
  bool bVar8;
  int32_t indexR;
  int32_t local_44;
  UErrorCode *local_40;
  UResourceDataEntry **local_38;
  
  pUVar6 = resBundle->fData;
  local_44 = -1;
  *res = 0xffffffff;
  if (pUVar6 != (UResourceDataEntry *)0x0) {
    bVar8 = pUVar6->fBogus == U_ZERO_ERROR;
    local_38 = realData;
    if (bVar8) {
      RVar3 = res_getTableItemByKey_63(&pUVar6->fData,(pUVar6->fData).rootRes,&local_44,resTag);
      *res = RVar3;
    }
    uVar7 = (uint)bVar8;
    if ((resBundle->fHasFallback == '\x01') && (*res == 0xffffffff)) {
      local_40 = status;
      do {
        pUVar1 = pUVar6->fParent;
        if (pUVar1 == (UResourceDataEntry *)0x0) break;
        if (pUVar1->fBogus == U_ZERO_ERROR) {
          uVar7 = uVar7 + 1;
          RVar3 = res_getTableItemByKey_63(&pUVar1->fData,(pUVar1->fData).rootRes,&local_44,resTag);
          *res = RVar3;
        }
        pUVar6 = pUVar1;
      } while (*res == 0xffffffff);
      bVar8 = 1 < (int)uVar7;
      status = local_40;
    }
    else {
      bVar8 = false;
    }
    ppUVar2 = local_38;
    if (*res != 0xffffffff) {
      if (bVar8) {
        __s1 = pUVar6->fName;
        __s2 = uloc_getDefault_63();
        iVar4 = strcmp(__s1,__s2);
        if (iVar4 == 0) {
          UVar5 = U_USING_DEFAULT_WARNING;
        }
        else {
          iVar4 = strcmp(pUVar6->fName,"root");
          UVar5 = (uint)(iVar4 == 0) | U_ERROR_WARNING_START;
        }
        *status = UVar5;
      }
      *ppUVar2 = pUVar6;
      return &pUVar6->fData;
    }
  }
  *status = U_MISSING_RESOURCE_ERROR;
  return (ResourceData *)0x0;
}

Assistant:

static const ResourceData *getFallbackData(const UResourceBundle* resBundle, const char* * resTag, UResourceDataEntry* *realData, Resource *res, UErrorCode *status) {
    UResourceDataEntry *resB = resBundle->fData;
    int32_t indexR = -1;
    int32_t i = 0;
    *res = RES_BOGUS;
    if(resB != NULL) {
        if(resB->fBogus == U_ZERO_ERROR) { /* if this resource is real, */
            *res = res_getTableItemByKey(&(resB->fData), resB->fData.rootRes, &indexR, resTag); /* try to get data from there */
            i++;
        }
        if(resBundle->fHasFallback == TRUE) {
            while(*res == RES_BOGUS && resB->fParent != NULL) { /* Otherwise, we'll look in parents */
                resB = resB->fParent;
                if(resB->fBogus == U_ZERO_ERROR) {
                    i++;
                    *res = res_getTableItemByKey(&(resB->fData), resB->fData.rootRes, &indexR, resTag);
                }
            }
        }

        if(*res != RES_BOGUS) { /* If the resource is found in parents, we need to adjust the error */
            if(i>1) {
                if(uprv_strcmp(resB->fName, uloc_getDefault())==0 || uprv_strcmp(resB->fName, kRootLocaleName)==0) {
                    *status = U_USING_DEFAULT_WARNING;
                } else {
                    *status = U_USING_FALLBACK_WARNING;
                }
            }
            *realData = resB;
            return (&(resB->fData));
        } else { /* If resource is not found, we need to give an error */
            *status = U_MISSING_RESOURCE_ERROR;
            return NULL;
        }
    } else {
            *status = U_MISSING_RESOURCE_ERROR;
            return NULL;
    }
}